

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib537.c
# Opt level: O0

void close_file_descriptors(void)

{
  for (num_open.rlim_cur = 0; num_open.rlim_cur < num_open.rlim_max;
      num_open.rlim_cur = num_open.rlim_cur + 1) {
    if (0 < fd[num_open.rlim_cur]) {
      close(fd[num_open.rlim_cur]);
    }
  }
  free(fd);
  fd = (int *)0x0;
  return;
}

Assistant:

static void close_file_descriptors(void)
{
  for(num_open.rlim_cur = 0;
      num_open.rlim_cur < num_open.rlim_max;
      num_open.rlim_cur++)
    if(fd[num_open.rlim_cur] > 0)
      close(fd[num_open.rlim_cur]);
  free(fd);
  fd = NULL;
}